

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_profiler.hpp
# Opt level: O2

void __thiscall fp::collector::~collector(collector *this)

{
  report(this);
  std::__cxx11::string::~string((string *)&this->m_fmt);
  return;
}

Assistant:

~collector() noexcept
  {
    report();
  }